

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dShape.cpp
# Opt level: O2

void __thiscall
btBox2dShape::calculateLocalInertia(btBox2dShape *this,btScalar mass,btVector3 *inertia)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  btVector3 bVar5;
  
  bVar5 = getHalfExtentsWithMargin(this);
  fVar3 = bVar5.m_floats[2] + bVar5.m_floats[2];
  fVar4 = mass / 12.0;
  fVar3 = fVar3 * fVar3;
  fVar1 = bVar5.m_floats[0] + bVar5.m_floats[0];
  fVar2 = bVar5.m_floats[1] + bVar5.m_floats[1];
  fVar2 = fVar2 * fVar2;
  *(ulong *)inertia->m_floats = CONCAT44((fVar1 * fVar1 + fVar3) * fVar4,(fVar2 + fVar3) * fVar4);
  inertia->m_floats[2] = (fVar1 * fVar1 + fVar2) * fVar4;
  inertia->m_floats[3] = 0.0;
  return;
}

Assistant:

void	btBox2dShape::calculateLocalInertia(btScalar mass,btVector3& inertia) const
{
	//btScalar margin = btScalar(0.);
	btVector3 halfExtents = getHalfExtentsWithMargin();

	btScalar lx=btScalar(2.)*(halfExtents.x());
	btScalar ly=btScalar(2.)*(halfExtents.y());
	btScalar lz=btScalar(2.)*(halfExtents.z());

	inertia.setValue(mass/(btScalar(12.0)) * (ly*ly + lz*lz),
					mass/(btScalar(12.0)) * (lx*lx + lz*lz),
					mass/(btScalar(12.0)) * (lx*lx + ly*ly));

}